

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

void * cgreen_vector_remove(CgreenVector *vector,int position)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  
  if (-1 < position) {
    if (vector == (CgreenVector *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = vector->size;
    }
    if (position <= iVar2) {
      uVar3 = (ulong)(uint)position;
      pvVar1 = vector->items[uVar3];
      iVar2 = vector->size;
      if (position < iVar2) {
        do {
          vector->items[uVar3] = vector->items[uVar3 + 1];
          position = position + 1;
          uVar3 = uVar3 + 1;
        } while (position < iVar2);
      }
      vector->items[iVar2] = (void *)0x0;
      vector->size = iVar2 + -1;
      return pvVar1;
    }
  }
  panic("src/vector.c",0x3c,"illegal position (%d) in vector operation");
}

Assistant:

void *cgreen_vector_remove(CgreenVector *vector, int position) {
    void *item;
    int i;

    if (position < 0 || position > cgreen_vector_size(vector)) {
        PANIC("illegal position (%d) in vector operation", position);
        return NULL;
    }

    item = vector->items[position];

    for (i = position; i < vector->size; i++) {
        vector->items[i] = vector->items[i + 1];
    }

    vector->items[vector->size] = NULL;

    vector->size--;
    return item;
}